

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial.h
# Opt level: O0

void __thiscall CBinomialHeap::InsertList(CBinomialHeap *this,CBinomialNode **otherRoot)

{
  CBinomialNode *pCVar1;
  CBinomialNode *temp;
  CBinomialNode *iter2;
  CBinomialNode *iter1;
  CBinomialNode *lefter;
  CBinomialNode **otherRoot_local;
  CBinomialHeap *this_local;
  
  iter1 = (CBinomialNode *)0x0;
  iter2 = this->root_;
  temp = *otherRoot;
  while (iter2 != (CBinomialNode *)0x0 && temp != (CBinomialNode *)0x0) {
    if (temp->degree_ < iter2->degree_) {
      if (iter1 == (CBinomialNode *)0x0) {
        this->root_ = temp;
      }
      else {
        iter1->next_ = temp;
      }
      pCVar1 = temp->next_;
      temp->next_ = iter2;
      iter1 = temp;
      temp = pCVar1;
    }
    else {
      iter1 = iter2;
      iter2 = iter2->next_;
    }
  }
  if (temp != (CBinomialNode *)0x0) {
    iter1->next_ = temp;
  }
  return;
}

Assistant:

void InsertList(CBinomialNode*& otherRoot) {

        CBinomialNode *lefter = nullptr, *iter1 = root_, *iter2 = otherRoot, *temp;

        while (iter1 && iter2) {
            if (iter1->degree_ <= iter2->degree_) {
                lefter = iter1;
                iter1 = iter1->next_;
                continue;
            }
            if (lefter)
                lefter->next_ = iter2;
            else
                root_ = iter2;
            temp = iter2->next_;
            iter2->next_ = iter1;
            lefter = iter2;
            iter2 = temp;
        }

        if (iter2) {
            lefter->next_ = iter2;
        }
    }